

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O3

void mk_rconf_free(mk_rconf *conf)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *__mptr;
  mk_list *__mptr_1;
  
  pmVar3 = (conf->includes).next;
  while (pmVar3 != &conf->includes) {
    pmVar1 = pmVar3->prev;
    pmVar2 = pmVar3->next;
    pmVar1->next = pmVar2;
    pmVar2->prev = pmVar1;
    pmVar3->prev = (mk_list *)0x0;
    pmVar3->next = (mk_list *)0x0;
    free(pmVar3[-1].next);
    free(&pmVar3[-1].next);
    pmVar3 = pmVar2;
  }
  pmVar3 = (conf->metas).next;
  while (pmVar3 != &conf->metas) {
    pmVar1 = pmVar3->prev;
    pmVar2 = pmVar3->next;
    pmVar1->next = pmVar2;
    pmVar2->prev = pmVar1;
    pmVar3->prev = (mk_list *)0x0;
    pmVar3->next = (mk_list *)0x0;
    free(pmVar3[-1].prev);
    free(pmVar3[-1].next);
    free(pmVar3 + -1);
    pmVar3 = pmVar2;
  }
  pmVar3 = (conf->sections).next;
  while (pmVar3 != &conf->sections) {
    pmVar1 = pmVar3->prev;
    pmVar2 = pmVar3->next;
    pmVar1->next = pmVar2;
    pmVar2->prev = pmVar1;
    pmVar3->prev = (mk_list *)0x0;
    pmVar3->next = (mk_list *)0x0;
    mk_rconf_free_entries((mk_rconf_section *)&pmVar3[-2].next);
    free(pmVar3[-2].next);
    free(&pmVar3[-2].next);
    pmVar3 = pmVar2;
  }
  if (conf->file != (char *)0x0) {
    free(conf->file);
  }
  free(conf->root_path);
  free(conf);
  return;
}

Assistant:

void mk_rconf_free(struct mk_rconf *conf)
{
    struct mk_list *head, *tmp;
    struct mk_rconf_section *section;
    struct mk_rconf_entry *entry;
    struct mk_rconf_file *file;

    /* Remove included files */
    mk_list_foreach_safe(head, tmp, &conf->includes) {
        file = mk_list_entry(head, struct mk_rconf_file, _head);
        mk_list_del(&file->_head);
        mk_mem_free(file->path);
        mk_mem_free(file);
    }

    /* Remove metas */
    mk_list_foreach_safe(head, tmp, &conf->metas) {
        entry = mk_list_entry(head, struct mk_rconf_entry, _head);
        mk_list_del(&entry->_head);
        mk_mem_free(entry->key);
        mk_mem_free(entry->val);
        mk_mem_free(entry);
    }

    /* Free sections */
    mk_list_foreach_safe(head, tmp, &conf->sections) {
        section = mk_list_entry(head, struct mk_rconf_section, _head);
        mk_list_del(&section->_head);

        /* Free section entries */
        mk_rconf_free_entries(section);

        /* Free section node */
        mk_mem_free(section->name);
        mk_mem_free(section);
    }
    if (conf->file) {
        mk_mem_free(conf->file);
    }

    mk_mem_free(conf->root_path);
    mk_mem_free(conf);
}